

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.h
# Opt level: O2

void __thiscall
pbrt::InstanceSceneEntity::InstanceSceneEntity
          (InstanceSceneEntity *this,string *name,FileLoc loc,
          AnimatedTransform *renderFromInstanceAnim,Transform *renderFromInstance)

{
  ParameterDictionary parameters;
  FileLoc loc_00;
  memory_resource *pmVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  
  uVar2 = (ParsedParameter *)0x0;
  uVar3 = (ParsedParameter *)0x0;
  uVar4 = (ParsedParameter *)0x0;
  uVar5 = (ParsedParameter *)0x0;
  uVar6 = (ParsedParameter *)0x0;
  uVar7 = (ParsedParameter *)0x0;
  uVar8 = (ParsedParameter *)0x0;
  uVar9 = (ParsedParameter *)0x0;
  pmVar1 = pstd::pmr::new_delete_resource();
  parameters.params.field_2.fixed[1] = (ParsedParameter *)pmVar1;
  parameters.params._0_24_ = loc;
  parameters.params.field_2.fixed[2] = (ParsedParameter *)0x0;
  parameters.params.field_2.fixed[3] = (ParsedParameter *)uVar2;
  parameters.params.field_2.fixed[4] = (ParsedParameter *)uVar3;
  parameters.params.field_2.fixed[5] = (ParsedParameter *)uVar4;
  parameters.params.field_2.fixed[6] = (ParsedParameter *)uVar5;
  parameters.params.field_2.fixed[7] = (ParsedParameter *)uVar6;
  parameters.params.nAlloc = uVar7;
  parameters.params.nStored = uVar8;
  parameters.colorSpace = (RGBColorSpace *)uVar9;
  loc_00.line = 0;
  loc_00.column = 0;
  loc_00.filename._M_len = 0;
  loc_00.filename._M_str = (char *)0x0;
  SceneEntity::SceneEntity(&this->super_SceneEntity,name,parameters,loc_00);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::~InlinedVector((InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                    *)&stack0xffffffffffffff70);
  memcpy(&this->renderFromInstanceAnim,renderFromInstanceAnim,0x2b8);
  this->renderFromInstance = renderFromInstance;
  return;
}

Assistant:

InstanceSceneEntity(const std::string &name, FileLoc loc,
                        const AnimatedTransform &renderFromInstanceAnim,
                        const Transform *renderFromInstance)
        : SceneEntity(name, {}, loc),
          renderFromInstanceAnim(renderFromInstanceAnim),
          renderFromInstance(renderFromInstance) {}